

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O3

int __thiscall Fl_Text_Buffer::count_lines(Fl_Text_Buffer *this,int startPos,int endPos)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = this->mGapStart;
  iVar2 = 0;
  iVar3 = startPos;
  if (startPos < iVar1) {
    lVar4 = 0;
    iVar2 = 0;
    do {
      if ((long)endPos - (long)startPos == lVar4) {
        return iVar2;
      }
      iVar2 = iVar2 + (uint)(this->mBuf[lVar4 + startPos] == '\n');
      lVar4 = lVar4 + 1;
      iVar3 = iVar1;
    } while (iVar1 - startPos != (int)lVar4);
  }
  if (iVar3 != endPos && iVar3 < this->mLength) {
    lVar4 = (long)iVar3;
    do {
      lVar4 = lVar4 + 1;
      iVar2 = (uint)(this->mBuf[lVar4 + (long)(this->mGapEnd - iVar1) + -1] == '\n') + iVar2;
      if (endPos == lVar4) {
        return iVar2;
      }
    } while (lVar4 < this->mLength);
  }
  return iVar2;
}

Assistant:

int Fl_Text_Buffer::count_lines(int startPos, int endPos) const {
  IS_UTF8_ALIGNED2(this, (startPos))
  IS_UTF8_ALIGNED2(this, (endPos))
  
  int gapLen = mGapEnd - mGapStart;
  int lineCount = 0;
  
  int pos = startPos;
  while (pos < mGapStart)
  {
    if (pos == endPos)
      return lineCount;
    if (mBuf[pos++] == '\n')
      lineCount++;
  } 
  while (pos < mLength) {
    if (pos == endPos)
      return lineCount;
    if (mBuf[pos++ + gapLen] == '\n')
      lineCount++;
  }
  return lineCount;
}